

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.hpp
# Opt level: O2

void __thiscall
CorUnix::CSharedMemoryObject::CSharedMemoryObject
          (CSharedMemoryObject *this,CObjectType *pot,CRITICAL_SECTION *pcsObjListLock,
          SHMPTR shmSharedObjectData,SHMObjData *psmod,bool fAddRefSharedData)

{
  undefined3 in_register_00000089;
  
  CPalObjectBase::CPalObjectBase(&this->super_CPalObjectBase,pot);
  (this->super_CPalObjectBase).super_IPalObject._vptr_IPalObject =
       (_func_int **)&PTR_GetObjectType_0135f7d0;
  this->m_pcsObjListLock = pcsObjListLock;
  this->m_shmod = shmSharedObjectData;
  this->m_pvSharedData = (VOID *)0x0;
  (this->m_ssmlSharedData).super_IDataLock._vptr_IDataLock = (_func_int **)&PTR_ReleaseLock_0135f9c8
  ;
  (this->m_sdlSharedData).super_IDataLock._vptr_IDataLock = (_func_int **)&PTR_ReleaseLock_0135f770;
  (this->m_sdlSharedData).m_fInitialized = false;
  this->m_ObjectDomain = SharedObject;
  this->m_fSharedDataDereferenced = 0;
  this->m_fDeleteSharedData = 0;
  (this->m_le).Blink = &this->m_le;
  (this->m_le).Flink = &this->m_le;
  if (CONCAT31(in_register_00000089,fAddRefSharedData) != 0) {
    psmod->lProcessRefCount = psmod->lProcessRefCount + 1;
  }
  return;
}

Assistant:

CSharedMemoryObject(
            CObjectType *pot,
            CRITICAL_SECTION *pcsObjListLock,
            SHMPTR shmSharedObjectData,
            SHMObjData *psmod,
            bool fAddRefSharedData
            )
            :
            CPalObjectBase(pot),
            m_pcsObjListLock(pcsObjListLock),
            m_shmod(shmSharedObjectData),
            m_pvSharedData(NULL),
            m_ObjectDomain(SharedObject),
            m_fSharedDataDereferenced(FALSE),
            m_fDeleteSharedData(FALSE)
        {
            InitializeListHead(&m_le);
            if (fAddRefSharedData)
            {
                psmod->lProcessRefCount += 1;
            }
        }